

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

Value * DumpSourceFileGroup(Value *__return_storage_ptr__,LanguageData *data,
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *files,string *baseDir)

{
  string *this;
  bool bVar1;
  ulong uVar2;
  Value *pVVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  string *local_2d8;
  Value local_280;
  Value local_258;
  undefined1 local_230 [8];
  string relPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Value sourcesValue;
  Value local_1a0;
  Value local_178;
  Value local_150;
  Value local_128;
  undefined1 local_100 [8];
  Value tmp;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *i;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *__range3;
  Value includes;
  Value local_58;
  byte local_29;
  string *local_28;
  string *baseDir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  LanguageData *data_local;
  Value *result;
  
  local_29 = 0;
  local_28 = baseDir;
  baseDir_local = (string *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)data;
  data_local = (LanguageData *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Json::Value::Value(&local_58,
                       (string *)
                       &(files_local->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kLANGUAGE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar3,&local_58);
    Json::Value::~Value(&local_58);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      Json::Value::Value((Value *)&includes.limit_,
                         (string *)
                         &files_local[1].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kCOMPILE_FLAGS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar3,(Value *)&includes.limit_);
      Json::Value::~Value((Value *)&includes.limit_);
    }
    bVar1 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)(files_local + 4));
    if (!bVar1) {
      Json::Value::Value((Value *)&__range3,arrayValue);
      this_00 = files_local + 4;
      __end3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)this_00);
      i = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
           *)std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                    *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                                         *)&i), bVar1) {
        tmp.limit_ = (ptrdiff_t)
                     __gnu_cxx::
                     __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                     ::operator*(&__end3);
        Json::Value::Value((Value *)local_100,objectValue);
        Json::Value::Value(&local_128,(string *)tmp.limit_);
        pVVar3 = Json::Value::operator[]((Value *)local_100,&kPATH_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar3,&local_128);
        Json::Value::~Value(&local_128);
        if ((*(byte *)(tmp.limit_ + 0x20) & 1) != 0) {
          Json::Value::Value(&local_150,(bool)(*(byte *)(tmp.limit_ + 0x20) & 1));
          pVVar3 = Json::Value::operator[]((Value *)local_100,&kIS_SYSTEM_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar3,&local_150);
          Json::Value::~Value(&local_150);
        }
        Json::Value::append((Value *)&__range3,(Value *)local_100);
        Json::Value::~Value((Value *)local_100);
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
        ::operator++(&__end3);
      }
      Json::Value::Value(&local_178,(Value *)&__range3);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kINCLUDE_PATH_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar3,&local_178);
      Json::Value::~Value(&local_178);
      Json::Value::~Value((Value *)&__range3);
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(files_local + 3);
    if (!bVar1) {
      (anonymous_namespace)::
      fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_1a0,(_anonymous_namespace_ *)(files_local + 3),in);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kDEFINES_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar3,&local_1a0);
      Json::Value::~Value(&local_1a0);
    }
  }
  Json::Value::Value((Value *)&sourcesValue.limit_,
                     (bool)(*(byte *)&(files_local->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start & 1));
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kIS_GENERATED_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar3,(Value *)&sourcesValue.limit_);
  Json::Value::~Value((Value *)&sourcesValue.limit_);
  Json::Value::Value((Value *)&__range1,arrayValue);
  this = baseDir_local;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)baseDir_local);
  i_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&i_1), bVar1) {
    relPath.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    cmSystemTools::RelativePath((string *)local_230,local_28,(string *)relPath.field_2._8_8_);
    uVar2 = std::__cxx11::string::size();
    uVar4 = std::__cxx11::string::size();
    if (uVar2 < uVar4) {
      local_2d8 = (string *)local_230;
    }
    else {
      local_2d8 = (string *)relPath.field_2._8_8_;
    }
    Json::Value::Value(&local_258,local_2d8);
    Json::Value::append((Value *)&__range1,&local_258);
    Json::Value::~Value(&local_258);
    std::__cxx11::string::~string((string *)local_230);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Json::Value::Value(&local_280,(Value *)&__range1);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kSOURCES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar3,&local_280);
  Json::Value::~Value(&local_280);
  local_29 = 1;
  Json::Value::~Value((Value *)&__range1);
  if ((local_29 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpSourceFileGroup(const LanguageData& data,
                                       const std::vector<std::string>& files,
                                       const std::string& baseDir)
{
  Json::Value result = Json::objectValue;

  if (!data.Language.empty()) {
    result[kLANGUAGE_KEY] = data.Language;
    if (!data.Flags.empty()) {
      result[kCOMPILE_FLAGS_KEY] = data.Flags;
    }
    if (!data.IncludePathList.empty()) {
      Json::Value includes = Json::arrayValue;
      for (auto const& i : data.IncludePathList) {
        Json::Value tmp = Json::objectValue;
        tmp[kPATH_KEY] = i.first;
        if (i.second) {
          tmp[kIS_SYSTEM_KEY] = i.second;
        }
        includes.append(tmp);
      }
      result[kINCLUDE_PATH_KEY] = includes;
    }
    if (!data.Defines.empty()) {
      result[kDEFINES_KEY] = fromStringList(data.Defines);
    }
  }

  result[kIS_GENERATED_KEY] = data.IsGenerated;

  Json::Value sourcesValue = Json::arrayValue;
  for (auto const& i : files) {
    const std::string relPath = cmSystemTools::RelativePath(baseDir, i);
    sourcesValue.append(relPath.size() < i.size() ? relPath : i);
  }

  result[kSOURCES_KEY] = sourcesValue;
  return result;
}